

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::
get_value<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>>
          (Attribute *this,
          vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *v)

{
  value_type *pvVar1;
  optional<std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>_>
  local_58;
  optional<std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>_>
  local_38;
  
  if (v == (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)0x0) {
    local_58.has_value_ = false;
  }
  else {
    primvar::PrimVar::
    get_value<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>>
              (&local_58,&this->_var);
    local_38.has_value_ = local_58.has_value_;
    if (local_58.has_value_ == true) {
      local_38.contained.data.__align = local_58.contained.data.__align;
      local_38.contained._8_8_ = local_58.contained._8_8_;
      local_38.contained._16_8_ = local_58.contained._16_8_;
      local_58.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_58.contained._8_8_ = 0;
      local_58.contained._16_8_ = 0;
      nonstd::optional_lite::
      optional<std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>_>::
      ~optional(&local_58);
      pvVar1 = nonstd::optional_lite::
               optional<std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>_>
               ::value(&local_38);
      std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::
      _M_move_assign(v,pvVar1);
    }
    else {
      nonstd::optional_lite::
      optional<std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>_>::
      ~optional(&local_58);
    }
    nonstd::optional_lite::
    optional<std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>_>::
    ~optional(&local_38);
  }
  return local_58.has_value_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }